

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O1

void __thiscall Calculator::parse(Calculator *this,String *e)

{
  Array<Calculator::Token> *this_00;
  Stack<Calculator::Token> *this_01;
  Token *x;
  char cVar1;
  char cVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  ulong uVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  Token *pTVar9;
  byte bVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  Array<Calculator::Token> *this_02;
  bool bVar15;
  char c;
  String name;
  String e1;
  byte local_99;
  Calculator *local_98;
  Token local_90;
  String local_68;
  anon_union_16_2_78e7fdac_for_String_2 *local_50;
  String local_48;
  
  iVar5 = 0;
  asl::Array<Calculator::Token>::resize(&this->_input,0);
  this_00 = &this->_output;
  local_98 = this;
  asl::Array<Calculator::Token>::resize(this_00,0);
  local_90.x = (double)CONCAT71(local_90.x._1_7_,0x20);
  asl::String::concat(&local_48,e,(char *)&local_90,1);
  uVar11 = local_48.field_2._str;
  if (local_48._size == 0) {
    uVar11 = &local_48.field_2;
  }
  local_68.field_2._space[0] = '\0';
  local_68._size = 0;
  local_68._len = 0;
  do {
    paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(uVar11 + 1);
    bVar14 = *(byte *)uVar11;
    local_99 = bVar14;
    if (bVar14 != 0) {
      if (iVar5 == 4) {
        if (((((byte)(bVar14 - 0x30) < 10) || (bVar14 == 0x65)) || (bVar14 == 0x2e)) ||
           ((bVar14 == 0x2d && (*(byte *)(uVar11 + -1) == 0x65)))) {
          iVar5 = 4;
          asl::String::operator+=(&local_68,bVar14);
        }
        else {
          paVar8 = &local_68.field_2;
          if (local_68._size != 0) {
            paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_68.field_2._1_7_,local_68.field_2._space[0]);
          }
          local_90.x = atof(paVar8->_space);
          local_90.val._size = 0;
          local_90.val._len = 0;
          local_90.val.field_2._space[0] = 0;
          local_90.type = NUMBER;
          asl::Array<Calculator::Token>::insert(&local_98->_input,-1,&local_90);
LAB_00106cb6:
          if (local_90.val._size != 0) {
            free((void *)CONCAT62(local_90.val.field_2._2_6_,
                                  CONCAT11(local_90.val.field_2._space[1],
                                           local_90.val.field_2._space[0])));
          }
          iVar5 = 0;
          paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)uVar11;
        }
      }
      else if (iVar5 == 3) {
        iVar5 = isalnum((int)(char)bVar14);
        if (iVar5 == 0) {
          iVar5 = local_68._len;
          asl::String::alloc(&local_90.val,local_68._len);
          local_90.val._len = iVar5;
          paVar8 = &local_90.val.field_2;
          if (local_90.val._size != 0) {
            paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT62(local_90.val.field_2._2_6_,
                              CONCAT11(local_90.val.field_2._space[1],local_90.val.field_2._space[0]
                                      ));
          }
          paVar6 = &local_68.field_2;
          if (local_68._size != 0) {
            paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_68.field_2._1_7_,local_68.field_2._space[0]);
          }
          memcpy(paVar8,paVar6,(long)iVar5 + 1);
          local_90.type = NAME;
          asl::Array<Calculator::Token>::insert(&local_98->_input,-1,&local_90);
          goto LAB_00106cb6;
        }
        iVar5 = 3;
        asl::String::operator+=(&local_68,bVar14);
      }
      else if (iVar5 == 0) {
        uVar4 = bVar14 - 0x28;
        if (uVar4 < 0x37) {
          if ((0x400000000000acU >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
            if ((3UL >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_00106d43;
            asl::String::alloc(&local_90.val,1);
            local_90.val._len = 1;
            paVar6 = &local_90.val.field_2;
            if (local_90.val._size != 0) {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       CONCAT62(local_90.val.field_2._2_6_,
                                CONCAT11(local_90.val.field_2._space[1],
                                         local_90.val.field_2._space[0]));
            }
            *(ushort *)paVar6 = (ushort)bVar14;
            local_90.type = SEP;
            asl::Array<Calculator::Token>::insert(&local_98->_input,-1,&local_90);
          }
          else {
            local_90.val._size = 0;
            local_90.val._len = 1;
            local_90.val.field_2._space[1] = '\0';
            local_90.type = OP;
            local_90.val.field_2._space[0] = bVar14;
            asl::Array<Calculator::Token>::insert(&local_98->_input,-1,&local_90);
          }
          if (local_90.val._size != 0) {
            free((void *)CONCAT62(local_90.val.field_2._2_6_,
                                  CONCAT11(local_90.val.field_2._space[1],
                                           local_90.val.field_2._space[0])));
          }
LAB_00106d32:
          iVar5 = 0;
        }
        else {
LAB_00106d43:
          if ((byte)(bVar14 - 0x30) < 10 || (byte)(bVar14 - 0x2d) < 2) {
            iVar5 = 4;
            asl::String::operator=(&local_68,(char *)&local_99);
          }
          else {
            iVar5 = isalpha((int)(char)bVar14);
            if (iVar5 == 0) goto LAB_00106d32;
            iVar5 = 3;
            asl::String::operator=(&local_68,(char *)&local_99);
          }
        }
      }
    }
    uVar11 = paVar8;
  } while (bVar14 != 0);
  lVar12 = (long)*(int *)((long)&(local_98->_input)._a[-1].val.field_2 + 8);
  if (0 < lVar12) {
    this_01 = &local_98->_operators;
    uVar7 = 0;
    uVar13 = lVar12 << 0x20;
LAB_00106dbe:
    pTVar9 = (local_98->_input)._a;
    iVar5 = (int)uVar13;
    if (3 < pTVar9[iVar5].type - OP) goto LAB_001071da;
    x = pTVar9 + iVar5;
    this_02 = this_00;
    switch(pTVar9[iVar5].type) {
    case OP:
      local_50 = &pTVar9[iVar5].val.field_2;
      paVar8 = local_50;
      if ((x->val)._size != 0) {
        paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
      }
      cVar1 = paVar8->_space[0];
      if (cVar1 != '-') goto LAB_00106fd1;
      if ((int)uVar7 != 0) {
        lVar12 = (long)((uVar13 << 0x20) + -0x100000000) >> 0x20;
        pTVar9 = (local_98->_input)._a;
        if (pTVar9[lVar12].type != OP) {
          if (pTVar9[lVar12].val._len == 1) {
            if (pTVar9[lVar12].val._size == 0) {
              paVar8 = &pTVar9[lVar12].val.field_2;
            }
            else {
              paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[lVar12].val.field_2._str;
            }
            if (paVar8->_space[0] == '(') goto LAB_00106e49;
          }
LAB_00106fd1:
          pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
          uVar4 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
          while (this_02 = &this_01->super_Array<Calculator::Token>, 0 < (int)uVar4) {
            iVar5 = pTVar9[(ulong)uVar4 - 1].val._len;
            if (iVar5 == 1) {
              if (pTVar9[(ulong)uVar4 - 1].val._size == 0) {
                paVar8 = &pTVar9[(ulong)uVar4 - 1].val.field_2;
              }
              else {
                paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                         pTVar9[(ulong)uVar4 - 1].val.field_2._str;
              }
              if (paVar8->_space[0] == '(') break;
            }
            bVar14 = 3;
            if (cVar1 == '^') {
              bVar10 = 3;
              if ((x->val)._len == 1) {
                paVar8 = local_50;
                if ((x->val)._size != 0) {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
                }
                cVar2 = paVar8->_space[0];
                bVar15 = cVar2 != '+';
                if ((cVar2 == '+') || (bVar15 = cVar2 != '-', !bVar15)) {
                  bVar10 = bVar15 * '\x02' + 1;
                }
                else {
                  bVar10 = (cVar2 == '*' || cVar2 == '/') ^ 3;
                }
              }
              if (iVar5 == 1) {
                if (pTVar9[(ulong)uVar4 - 1].val._size == 0) {
                  paVar8 = &pTVar9[(ulong)uVar4 - 1].val.field_2;
                }
                else {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                           pTVar9[(ulong)uVar4 - 1].val.field_2._str;
                }
                cVar2 = paVar8->_space[0];
                bVar15 = cVar2 != '+';
                if ((cVar2 == '+') || (bVar15 = cVar2 != '-', !bVar15)) {
                  bVar14 = bVar15 * '\x02' + 1;
                }
                else {
                  bVar14 = (cVar2 == '*' || cVar2 == '/') ^ 3;
                }
              }
              if (bVar14 <= bVar10) break;
            }
            else {
              bVar10 = 3;
              if ((x->val)._len == 1) {
                paVar8 = local_50;
                if ((x->val)._size != 0) {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
                }
                cVar2 = paVar8->_space[0];
                bVar15 = cVar2 != '+';
                if ((cVar2 == '+') || (bVar15 = cVar2 != '-', !bVar15)) {
                  bVar10 = bVar15 * '\x02' + 1;
                }
                else {
                  bVar10 = (cVar2 == '*' || cVar2 == '/') ^ 3;
                }
              }
              if (iVar5 == 1) {
                if (pTVar9[(ulong)uVar4 - 1].val._size == 0) {
                  paVar8 = &pTVar9[(ulong)uVar4 - 1].val.field_2;
                }
                else {
                  paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                           pTVar9[(ulong)uVar4 - 1].val.field_2._str;
                }
                cVar2 = paVar8->_space[0];
                bVar15 = cVar2 != '+';
                if ((cVar2 == '+') || (bVar15 = cVar2 != '-', !bVar15)) {
                  bVar14 = bVar15 * '\x02' + 1;
                }
                else {
                  bVar14 = (cVar2 == '*' || cVar2 == '/') ^ 3;
                }
              }
              if (bVar14 < bVar10) break;
            }
            asl::Stack<Calculator::Token>::popget(&local_90,this_01);
            asl::Array<Calculator::Token>::insert(this_00,-1,&local_90);
            if (local_90.val._size != 0) {
              free((void *)CONCAT62(local_90.val.field_2._2_6_,
                                    CONCAT11(local_90.val.field_2._space[1],
                                             local_90.val.field_2._space[0])));
            }
            pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
            uVar4 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
          }
          goto switchD_00106df1_caseD_4;
        }
      }
LAB_00106e49:
      local_90.val._size = 0;
      local_90.val._len = 1;
      local_90.val.field_2._space[0] = 0x5f;
      local_90.val.field_2._space[1] = '\0';
      local_90.type = OP;
      asl::Array<Calculator::Token>::insert(&this_01->super_Array<Calculator::Token>,-1,&local_90);
      break;
    case SEP:
      if ((x->val)._size == 0) {
        paVar8 = &(x->val).field_2;
      }
      else {
        paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)(x->val).field_2._str;
      }
      bVar14 = paVar8->_space[0];
      if (bVar14 != 0x28) {
        if (bVar14 == 0x29) {
LAB_00106ee4:
          pTVar9 = (this_01->super_Array<Calculator::Token>)._a;
          iVar5 = *(int *)((long)&pTVar9[-1].val.field_2 + 8);
          if (pTVar9[(long)iVar5 + -1].val._len == 1) {
            if (pTVar9[(long)iVar5 + -1].val._size == 0) {
              paVar8 = &pTVar9[(long)iVar5 + -1].val.field_2;
            }
            else {
              paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       pTVar9[(long)iVar5 + -1].val.field_2._str;
            }
            if (paVar8->_space[0] == '(') goto LAB_00106f87;
          }
          asl::Stack<Calculator::Token>::popget(&local_90,this_01);
          asl::Array<Calculator::Token>::insert(this_00,-1,&local_90);
          if (local_90.val._size != 0) {
            free((void *)CONCAT62(local_90.val.field_2._2_6_,
                                  CONCAT11(local_90.val.field_2._space[1],
                                           local_90.val.field_2._space[0])));
          }
          goto LAB_00106ee4;
        }
        goto LAB_001071da;
      }
      local_90.val._size = 0;
      local_90.val._len = 1;
      local_90.val.field_2._space[1] = '\0';
      local_90.type = OP;
      local_90.val.field_2._space[0] = bVar14;
      asl::Array<Calculator::Token>::insert(&this_01->super_Array<Calculator::Token>,-1,&local_90);
      break;
    case NAME:
      iVar5 = iVar5 + 1;
      pTVar9 = (local_98->_input)._a;
      if ((pTVar9[iVar5].type == SEP) && (pTVar9[iVar5].val._len == 1)) {
        if (pTVar9[iVar5].val._size == 0) {
          paVar8 = &pTVar9[iVar5].val.field_2;
        }
        else {
          paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[iVar5].val.field_2._str;
        }
        this_02 = &this_01->super_Array<Calculator::Token>;
        if (paVar8->_space[0] != '(') {
          this_02 = this_00;
        }
      }
    case NUMBER:
switchD_00106df1_caseD_4:
      asl::Array<Calculator::Token>::insert(this_02,-1,x);
      goto LAB_001071da;
    }
    if (local_90.val._size != 0) {
      free((void *)CONCAT62(local_90.val.field_2._2_6_,
                            CONCAT11(local_90.val.field_2._space[1],local_90.val.field_2._space[0]))
          );
    }
    goto LAB_001071da;
  }
LAB_00107202:
  pTVar9 = (local_98->_operators).super_Array<Calculator::Token>._a;
  uVar4 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
  if (0 < (int)uVar4) {
    local_98 = (Calculator *)&local_98->_operators;
    do {
      uVar7 = (ulong)uVar4;
      if (pTVar9[uVar7 - 1].val._len == 1) {
        if (pTVar9[uVar7 - 1].val._size == 0) {
          paVar8 = &pTVar9[uVar7 - 1].val.field_2;
        }
        else {
          paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[uVar7 - 1].val.field_2._str;
        }
        if (paVar8->_space[0] != '(') {
          if (pTVar9[uVar7 - 1].val._size == 0) {
            paVar8 = &pTVar9[uVar7 - 1].val.field_2;
          }
          else {
            paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)pTVar9[uVar7 - 1].val.field_2._str;
          }
          if (paVar8->_space[0] != ')') goto LAB_00107263;
        }
        puts("Mismatch");
        break;
      }
LAB_00107263:
      asl::Stack<Calculator::Token>::popget(&local_90,(Stack<Calculator::Token> *)local_98);
      asl::Array<Calculator::Token>::insert(this_00,-1,&local_90);
      if (local_90.val._size != 0) {
        free((void *)CONCAT62(local_90.val.field_2._2_6_,
                              CONCAT11(local_90.val.field_2._space[1],local_90.val.field_2._space[0]
                                      )));
      }
      pTVar9 = (local_98->_input)._a;
      uVar4 = *(uint *)((long)&pTVar9[-1].val.field_2 + 8);
    } while (0 < (int)uVar4);
  }
  if (local_68._size != 0) {
    free((void *)CONCAT71(local_68.field_2._1_7_,local_68.field_2._space[0]));
  }
  if (local_48._size != 0) {
    free(local_48.field_2._str);
  }
  return;
LAB_00106f87:
  asl::Array<Calculator::Token>::resize(&this_01->super_Array<Calculator::Token>,iVar5 + -1);
LAB_001071da:
  uVar7 = uVar13 + 1;
  uVar3 = uVar13 >> 0x20;
  uVar13 = uVar13 & 0xffffffff00000000 | uVar7 & 0xffffffff;
  if ((int)uVar3 <= (int)uVar7) goto LAB_00107202;
  goto LAB_00106dbe;
}

Assistant:

void Calculator::parse(const String& e)
{
	_input.clear();
	_output.clear();
	String e1 = e + ' ';
	const char* p = e1;
	String name;
	TokenType type = NONE;
	while (char c = *p++)
	{
		switch (type) {
		case NONE:
			switch (c)
			{
			case '+': case '-': case '*': case '/': case '^':
				_input << c;
				break;
			case '(': case ')':
				_input << Token(SEP, String(c));
				break;
			default:
				if ((c >= '0' && c <= '9') || c == '.' || c == '-') {
					type = NUMBER;
					name = c;
				}
				else if (isalpha(c)) {
					type = NAME;
					name = c;
				}
				break;
			}
			break;
		case NUMBER:
			if (!((c >= '0' && c <= '9') || c == '.' || c == 'e' || (c=='-' && *(p-2)=='e'))) {
				_input << Token((double)name);
				type = NONE;
				p--;
				break;
			}
			else
				name << c;
			break;
		case NAME:
			if (isalnum(c))
				name << c;
			else
			{
				_input << Token(NAME, name);
				p--;
				type = NONE;
			}
			break;
		default:
			break;
		}
	}

	// build reverse

	foreach2(int i, const Token& token, _input)
	{
		char op;
		switch (token.type)
		{
		case NUMBER: _output << token;
			break;
		case NAME:
			if (_input[i + 1].type == SEP && _input[i + 1].val == '(')
				_operators.push(token);
			else
				_output << token;
			break;
		case SEP:
			op = token.val[0];
			switch (op)
			{
			case '(': _operators.push(op);
				break;
			case ')':
				while (_operators.top().val != '(')
					_output << _operators.popget();
				_operators.pop();
				break;
			}
			break;

		case OP:
			op = token.val[0];
			if (op == '-' && (i == 0 || _input[i - 1].type == OP || _input[i - 1].val == '('))
			{
				_operators.push('_');
				break;
			}
			while (_operators.length() > 0 && _operators.top().val != '(' && (
				(op != '^' && precedence(token.val) <= precedence(_operators.top().val)) ||
				(op == '^' && precedence(token.val) < precedence(_operators.top().val))))
				_output << _operators.popget();
			_operators.push(token);
		default:
			break;
		}
	}

	while (_operators.length() > 0)
	{
		if (_operators.top().val == '(' || _operators.top().val == ')') {
			printf("Mismatch\n");
			return;
		}
		else
			_output << _operators.popget();
	}
}